

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptBitsDel(poptBits bits,char *s)

{
  byte bVar1;
  size_t size;
  int iVar2;
  ulong uVar3;
  uint32_t h1;
  uint32_t h0;
  
  if (s == (char *)0x0) {
    size = 0;
  }
  else {
    size = strlen(s);
  }
  _h1 = 0;
  if (size == 0 || bits == (poptBits)0x0) {
    iVar2 = -0x14;
  }
  else {
    poptJlu32lpair(s,size,&h0,&h1);
    iVar2 = 0;
    for (uVar3 = 0; uVar3 < _poptBitsK; uVar3 = uVar3 + 1) {
      bVar1 = (byte)((ulong)h0 % (ulong)_poptBitsM) & 0x1f;
      bits[(ulong)h0 % (ulong)_poptBitsM >> 5].bits[0] =
           bits[(ulong)h0 % (ulong)_poptBitsM >> 5].bits[0] &
           (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      h0 = h0 + h1;
    }
  }
  return iVar2;
}

Assistant:

int poptBitsDel(poptBits bits, const char * s)
{
    size_t ns = (s ? strlen(s) : 0);
    uint32_t h0 = 0;
    uint32_t h1 = 0;

    if (bits == NULL || ns == 0)
	return POPT_ERROR_NULLARG;

    poptJlu32lpair(s, ns, &h0, &h1);

    for (ns = 0; ns < (size_t)_poptBitsK; ns++) {
        uint32_t h = h0 + ns * h1;
        uint32_t ix = (h % _poptBitsM);
        PBM_CLR(ix, bits);
    }
    return 0;
}